

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEException.cpp
# Opt level: O0

bool __thiscall test_CEException::test_invalid_value(test_CEException *this)

{
  undefined8 uVar1;
  invalid_value *e;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  invalid_value *in_stack_ffffffffffffff70;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  uVar1 = __cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"test_CEException::test_invalid_value()",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Testing throwing \'CEException::invalid_value\'",&local_61)
  ;
  CEException::invalid_value::invalid_value
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  __cxa_throw(uVar1,&CEException::invalid_value::typeinfo,CEException::invalid_value::~invalid_value
             );
}

Assistant:

bool test_CEException::test_invalid_value(void)
{
    // Try throwing
    try {
        throw CEException::invalid_value("test_CEException::test_invalid_value()",
                                         "Testing throwing 'CEException::invalid_value'");
        // If we get here there's a problem
        log_failure("CEException::invalid_value failed to throw", __func__, __LINE__);
        update_pass(false);
    } catch (CEException::invalid_value & e) {
        // This is where we should be
        log_success("CEException::invalid_value thrown successfully", __func__, __LINE__);
        update_pass(true);
    }

    return pass();
}